

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O3

int __thiscall Thread::join(Thread *this)

{
  int iVar1;
  
  if (this->started_ == false) {
    __assert_fail("started_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ruanyvan[P]WebServer/WebServer/base/Thread.cpp"
                  ,0x60,"int Thread::join()");
  }
  if (this->joined_ != true) {
    this->joined_ = true;
    iVar1 = pthread_join(this->pthreadId_,(void **)0x0);
    return iVar1;
  }
  __assert_fail("!joined_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ruanyvan[P]WebServer/WebServer/base/Thread.cpp"
                ,0x61,"int Thread::join()");
}

Assistant:

int Thread::join(){
    assert(started_);
    assert(!joined_);
    joined_=true;
    return pthread_join(pthreadId_, nullptr);
}